

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O2

bool duckdb::CSVCast::TryCastFloatingVectorCommaSeparated
               (CSVReaderOptions *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,LogicalType *result_type,idx_t *line_error)

{
  bool bVar1;
  InternalException *this;
  allocator local_39;
  string local_38;
  
  if (result_type->physical_type_ == FLOAT) {
    bVar1 = TemplatedTryCastFloatingVector<duckdb::TryCastErrorMessageCommaSeparated,float>
                      (options,input_vector,result_vector,count,parameters,line_error);
    return bVar1;
  }
  if (result_type->physical_type_ == DOUBLE) {
    bVar1 = TemplatedTryCastFloatingVector<duckdb::TryCastErrorMessageCommaSeparated,double>
                      (options,input_vector,result_vector,count,parameters,line_error);
    return bVar1;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Unimplemented physical type for floating",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static bool TryCastFloatingVectorCommaSeparated(const CSVReaderOptions &options, Vector &input_vector,
	                                                Vector &result_vector, idx_t count, CastParameters &parameters,
	                                                const LogicalType &result_type, idx_t &line_error) {
		switch (result_type.InternalType()) {
		case PhysicalType::DOUBLE:
			return TemplatedTryCastFloatingVector<TryCastErrorMessageCommaSeparated, double>(
			    options, input_vector, result_vector, count, parameters, line_error);
		case PhysicalType::FLOAT:
			return TemplatedTryCastFloatingVector<TryCastErrorMessageCommaSeparated, float>(
			    options, input_vector, result_vector, count, parameters, line_error);
		default:
			throw InternalException("Unimplemented physical type for floating");
		}
	}